

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall UKF::ProcessMeasurement(UKF *this,MeasurementPackage *meas_package)

{
  Scalar SVar1;
  float fVar2;
  float fVar3;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  Scalar *pSVar6;
  double dVar7;
  MeasurementPackage local_1a8;
  MeasurementPackage local_188;
  float local_168;
  float local_164;
  float dt;
  float ro_dot;
  float phi;
  float ro;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  Scalar local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_90;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60 [3];
  Scalar local_48;
  Scalar local_40;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  MeasurementPackage *local_18;
  MeasurementPackage *meas_package_local;
  UKF *this_local;
  
  if (((meas_package->sensor_type_ == RADAR) && ((this->use_radar_ & 1U) != 0)) ||
     ((meas_package->sensor_type_ == LASER && ((this->use_laser_ & 1U) != 0)))) {
    local_18 = meas_package;
    meas_package_local = (MeasurementPackage *)this;
    if ((this->is_initialized_ & 1U) == 0) {
      local_40 = 1.0;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_38,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,&local_40
                );
      local_48 = 1.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_38,&local_48);
      local_60[0] = 1.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar4,local_60);
      local_68 = 1.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar4,&local_68);
      local_70 = 0.1;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar4,&local_70);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_38)
      ;
      local_98 = 0.15;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
                (&local_90,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->P_,
                 &local_98);
      local_a0 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (&local_90,&local_a0);
      local_a8 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_a8);
      local_b0 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_b0);
      local_b8 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_b8);
      local_c0 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_c0);
      local_c8 = 0.15;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_c8);
      local_d0 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_d0);
      local_d8 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_d8);
      local_e0 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_e0);
      local_e8 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_e8);
      local_f0 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_f0);
      local_f8 = 1.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_f8);
      local_100 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_100);
      local_108 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_108);
      local_110 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_110);
      local_118 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_118);
      local_120 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_120);
      local_128 = 1.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_128);
      local_130 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_130);
      local_138 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_138);
      local_140 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_140);
      local_148 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_148);
      local_150 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_150);
      _phi = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar5,(Scalar *)&phi);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                (&local_90);
      this->time_us_ = meas_package->timestamp_;
      if ((meas_package->sensor_type_ == LASER) && ((this->use_laser_ & 1U) != 0)) {
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            &meas_package->raw_measurements_,0);
        SVar1 = *pSVar6;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->x_,
                            0);
        *pSVar6 = SVar1;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            &meas_package->raw_measurements_,1);
        SVar1 = *pSVar6;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->x_,
                            1);
        *pSVar6 = SVar1;
      }
      else if ((meas_package->sensor_type_ == RADAR) && ((this->use_radar_ & 1U) != 0)) {
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            &meas_package->raw_measurements_,0);
        ro_dot = (float)*pSVar6;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            &meas_package->raw_measurements_,1);
        dt = (float)*pSVar6;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            &meas_package->raw_measurements_,2);
        fVar2 = ro_dot;
        local_164 = (float)*pSVar6;
        dVar7 = std::cos((double)(ulong)(uint)dt);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->x_,
                            0);
        fVar3 = ro_dot;
        *pSVar6 = (double)(fVar2 * SUB84(dVar7,0));
        dVar7 = std::sin((double)(ulong)(uint)dt);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->x_,
                            1);
        *pSVar6 = (double)(fVar3 * SUB84(dVar7,0));
      }
      this->is_initialized_ = true;
    }
    else {
      local_168 = (float)((double)(meas_package->timestamp_ - this->time_us_) / 1000000.0);
      this->time_us_ = meas_package->timestamp_;
      Prediction(this,(double)local_168);
      if (meas_package->sensor_type_ == LASER) {
        MeasurementPackage::MeasurementPackage(&local_188,meas_package);
        UpdateLidar(this,&local_188);
        MeasurementPackage::~MeasurementPackage(&local_188);
      }
      else if (meas_package->sensor_type_ == RADAR) {
        MeasurementPackage::MeasurementPackage(&local_1a8,meas_package);
        UpdateRadar(this,&local_1a8);
        MeasurementPackage::~MeasurementPackage(&local_1a8);
      }
    }
  }
  return;
}

Assistant:

void UKF::ProcessMeasurement(MeasurementPackage meas_package) {
  /**
  TODO:
  Complete this function! Make sure you switch between lidar and radar
  measurements.
  */
  
  // skip predict/update if sensor type is ignored
  if ((meas_package.sensor_type_ == MeasurementPackage::RADAR && use_radar_) ||
      (meas_package.sensor_type_ == MeasurementPackage::LASER && use_laser_)) {
    
    /*****************************************************************************
    *  Initialization
    ****************************************************************************/
    if (!is_initialized_) {
      /**
      TODO:
      * Initialize the state x_ with the first measurement.
      * Create the covariance matrix.
      * Remember: you'll need to convert radar from polar to cartesian coordinates.
      */
      /**
      Initialize state.
      */

      // first measurement
      x_ << 1, 1, 1, 1, 0.1;

      // init covariance matrix
      P_ << 0.15,    0, 0, 0, 0,
               0, 0.15, 0, 0, 0,
               0,    0, 1, 0, 0,
               0,    0, 0, 1, 0,
               0,    0, 0, 0, 1;

      // init timestamp
      time_us_ = meas_package.timestamp_;

      if (meas_package.sensor_type_ == MeasurementPackage::LASER && use_laser_) {

        x_(0) = meas_package.raw_measurements_(0);
        x_(1) = meas_package.raw_measurements_(1);

      }
      else if (meas_package.sensor_type_ == MeasurementPackage::RADAR && use_radar_) {
        /**
        Convert radar from polar to cartesian coordinates and initialize state.
        */
        float ro = meas_package.raw_measurements_(0);
        float phi = meas_package.raw_measurements_(1);
        float ro_dot = meas_package.raw_measurements_(2);
        x_(0) = ro     * cos(phi);
        x_(1) = ro     * sin(phi);
      }

      // done initializing, no need to predict or update
      is_initialized_ = true;

      return;
    }

    /*****************************************************************************
    *  Prediction
    ****************************************************************************/
    //compute the time elapsed between the current and previous measurements
    float dt = (meas_package.timestamp_ - time_us_) / 1000000.0;	//dt - expressed in seconds
    time_us_ = meas_package.timestamp_;

    Prediction(dt);

    /*****************************************************************************
    *  Update
    ****************************************************************************/

    if (meas_package.sensor_type_ == MeasurementPackage::LASER) {
      UpdateLidar(meas_package);
    }
    else if (meas_package.sensor_type_ == MeasurementPackage::RADAR) {
      UpdateRadar(meas_package);
    }
  }
}